

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProductEvaluators.h
# Opt level: O3

void Eigen::internal::
     Assignment<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_Eigen::Product<Eigen::TriangularView<const_Eigen::Transpose<const_Eigen::Matrix<float,_-1,_-1,_1,_-1,_-1>_>,_1U>,_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0>,_Eigen::internal::assign_op<float,_float>,_Eigen::internal::Dense2Dense,_void>
     ::run(Matrix<float,__1,__1,_0,__1,__1> *dst,SrcXprType *src,assign_op<float,_float> *param_3)

{
  undefined1 auVar1 [16];
  undefined8 *puVar2;
  ActualDstType actualDst;
  RhsNested a_rhs;
  assign_op<float,_float> local_39;
  CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>
  local_38;
  
  a_rhs = src->m_rhs;
  local_38.m_rows.m_value =
       (((src->m_lhs).m_matrix.m_matrix)->
       super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_1,__1,__1>_>).m_storage.m_cols;
  local_38.m_cols.m_value =
       (a_rhs->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>).m_storage.m_cols;
  if (((dst->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>).m_storage.m_rows !=
       local_38.m_rows.m_value) ||
     ((dst->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>).m_storage.m_cols !=
      local_38.m_cols.m_value)) {
    if ((local_38.m_cols.m_value | local_38.m_rows.m_value) < 0) {
      __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/PlainObjectBase.h"
                    ,0x115,
                    "void Eigen::PlainObjectBase<Eigen::Matrix<float, -1, -1>>::resize(Index, Index) [Derived = Eigen::Matrix<float, -1, -1>]"
                   );
    }
    if ((local_38.m_cols.m_value != 0 && local_38.m_rows.m_value != 0) &&
       (auVar1 = ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff),
       SUB168(auVar1 / SEXT816(local_38.m_cols.m_value),0) < local_38.m_rows.m_value)) {
      puVar2 = (undefined8 *)
               __cxa_allocate_exception(8,src,SUB168(auVar1 % SEXT816(local_38.m_cols.m_value),0));
      *puVar2 = boost::program_options::detail::cmdline::cmdline;
      __cxa_throw(puVar2,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    DenseStorage<float,_-1,_-1,_-1,_0>::resize
              ((DenseStorage<float,__1,__1,__1,_0> *)dst,
               local_38.m_cols.m_value * local_38.m_rows.m_value,local_38.m_rows.m_value,
               local_38.m_cols.m_value);
    a_rhs = src->m_rhs;
    local_38.m_rows.m_value =
         (dst->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>).m_storage.m_rows;
    local_38.m_cols.m_value =
         (dst->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>).m_storage.m_cols;
  }
  local_38.m_functor.m_other = 0.0;
  if (-1 < (local_38.m_cols.m_value | local_38.m_rows.m_value)) {
    call_dense_assignment_loop<Eigen::Matrix<float,_1,_1,0,_1,_1>>(dst,&local_38,&local_39);
    local_38.m_rows.m_value._0_4_ = 0x3f800000;
    triangular_product_impl<1,true,Eigen::Transpose<Eigen::Matrix<float,-1,-1,1,-1,-1>const>const,false,Eigen::Matrix<float,-1,-1,0,-1,-1>,false>
    ::run<Eigen::Matrix<float,_1,_1,0,_1,_1>>
              (dst,(Transpose<const_Eigen::Matrix<float,__1,__1,_1,__1,__1>_> *)src,a_rhs,
               (Scalar *)&local_38);
    return;
  }
  __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/CwiseNullaryOp.h"
                ,0x4a,
                "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, Eigen::Matrix<float, -1, -1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<float>, MatrixType = Eigen::Matrix<float, -1, -1>]"
               );
}

Assistant:

void run(DstXprType &dst, const SrcXprType &src, const internal::assign_op<Scalar,Scalar> &)
  {
    Index dstRows = src.rows();
    Index dstCols = src.cols();
    if((dst.rows()!=dstRows) || (dst.cols()!=dstCols))
      dst.resize(dstRows, dstCols);
    // FIXME shall we handle nested_eval here?
    generic_product_impl<Lhs, Rhs>::evalTo(dst, src.lhs(), src.rhs());
  }